

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SetPluginTest.cpp
# Opt level: O2

void __thiscall
TEST_GROUP_CppUTestGroupSetPointerPluginTest::setup
          (TEST_GROUP_CppUTestGroupSetPointerPluginTest *this)

{
  TestRegistry *pTVar1;
  SetPointerPlugin *this_00;
  StringBufferTestOutput *this_01;
  TestResult *this_02;
  SimpleString local_20;
  
  pTVar1 = (TestRegistry *)
           operator_new(0x38,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SetPluginTest.cpp"
                        ,0x22);
  TestRegistry::TestRegistry(pTVar1);
  this->myRegistry_ = pTVar1;
  this_00 = (SetPointerPlugin *)
            operator_new(0x28,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SetPluginTest.cpp"
                         ,0x23);
  SimpleString::SimpleString(&local_20,"TestSetPlugin");
  SetPointerPlugin::SetPointerPlugin(this_00,&local_20);
  this->plugin_ = this_00;
  SimpleString::~SimpleString(&local_20);
  pTVar1 = this->myRegistry_;
  (*pTVar1->_vptr_TestRegistry[0x17])(pTVar1,pTVar1);
  (*this->myRegistry_->_vptr_TestRegistry[0xd])(this->myRegistry_,this->plugin_);
  this_01 = (StringBufferTestOutput *)
            operator_new(0x30,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SetPluginTest.cpp"
                         ,0x26);
  StringBufferTestOutput::StringBufferTestOutput(this_01);
  this->output_ = this_01;
  this_02 = (TestResult *)
            operator_new(0x70,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SetPluginTest.cpp"
                         ,0x27);
  TestResult::TestResult(this_02,&this->output_->super_TestOutput);
  this->result_ = this_02;
  return;
}

Assistant:

void setup() _override
    {
        myRegistry_ = new TestRegistry();
        plugin_ = new SetPointerPlugin("TestSetPlugin");
        myRegistry_->setCurrentRegistry(myRegistry_);
        myRegistry_->installPlugin(plugin_);
        output_ = new StringBufferTestOutput();
        result_ = new TestResult(*output_);
    }